

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredQLastTimeStepOrElse.cpp
# Opt level: O2

Scope * __thiscall
FactoredQLastTimeStepOrElse::GetAgentScopeForLQF
          (FactoredQLastTimeStepOrElse *this,Index e,Index stage)

{
  long lVar1;
  const_reference pvVar2;
  E *this_00;
  
  lVar1 = (**(code **)(*(long *)&this->super_QFunctionForFactoredDecPOMDP + 0x78))
                    (&this->super_QFunctionForFactoredDecPOMDP);
  if (*(int *)(lVar1 + 0x18) - 1U == stage) {
    pvVar2 = std::vector<Scope,_std::allocator<Scope>_>::at(&this->_m_agentScopes,(ulong)e);
    return pvVar2;
  }
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,"FactoredQLastTimeStepOrElse::GetNrLQFs called for stage other than the last!");
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

const Scope& FactoredQLastTimeStepOrElse::GetAgentScopeForLQF(Index e,Index stage) const
{
    Index last_stage = GetPUF()->GetHorizon() - 1;
    if(stage != last_stage)
        throw E("FactoredQLastTimeStepOrElse::GetNrLQFs called for stage other than the last!");
    return _m_agentScopes.at(e);
}